

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.cpp
# Opt level: O2

void __thiscall
duckdb::PartitionedTupleData::BuildBufferSpace<true>
          (PartitionedTupleData *this,PartitionedTupleDataAppendState *state)

{
  long lVar1;
  pointer pTVar2;
  _Head_base<0UL,_duckdb::list_entry_t_*,_false> _Var3;
  long lVar4;
  type this_00;
  idx_t iVar5;
  idx_t iVar6;
  const_iterator it;
  const_iterator local_60;
  TupleDataChunkState *local_48;
  PartitionedTupleDataAppendState *local_40;
  fixed_size_map_t<duckdb::list_entry_t> *local_38;
  
  local_38 = &state->fixed_partition_entries;
  fixed_size_map_t<duckdb::list_entry_t>::begin(&local_60,local_38);
  local_48 = &state->chunk_state;
  local_40 = state;
  while( true ) {
    if (((uint)local_38->capacity & 7) == local_60.idx_in_entry &&
        local_38->capacity >> 3 == local_60.entry_idx) break;
    lVar1 = local_60.idx_in_entry + local_60.entry_idx * 8;
    this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator*((this->partitions).
                          super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar1);
    pTVar2 = (local_40->partition_pin_states).
             super_vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>.
             super__Vector_base<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var3._M_head_impl =
         ((local_60.map)->values).
         super_unique_ptr<duckdb::list_entry_t[],_std::default_delete<duckdb::list_entry_t[]>_>._M_t
         .super___uniq_ptr_impl<duckdb::list_entry_t,_std::default_delete<duckdb::list_entry_t[]>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::list_entry_t_*,_std::default_delete<duckdb::list_entry_t[]>_>
         .super__Head_base<0UL,_duckdb::list_entry_t_*,_false>._M_head_impl;
    lVar4 = _Var3._M_head_impl[local_60.entry_idx * 8 + local_60.idx_in_entry].offset;
    iVar6 = *(idx_t *)((long)(_Var3._M_head_impl + local_60.entry_idx * 8 + local_60.idx_in_entry) +
                      8);
    iVar5 = TupleDataCollection::SizeInBytes(this_00);
    TupleDataCollection::Build(this_00,pTVar2 + lVar1,local_48,lVar4 - iVar6,iVar6);
    iVar6 = TupleDataCollection::SizeInBytes(this_00);
    this->data_size = this->data_size + (iVar6 - iVar5);
    fixed_size_map_iterator<duckdb::list_entry_t,_true>::operator++(&local_60);
  }
  return;
}

Assistant:

void PartitionedTupleData::BuildBufferSpace(PartitionedTupleDataAppendState &state) {
	using GETTER = TemplatedMapGetter<list_entry_t, fixed>;
	const auto &partition_entries = state.GetMap<fixed>();
	for (auto it = partition_entries.begin(); it != partition_entries.end(); ++it) {
		const auto &partition_index = GETTER::GetKey(it);

		// Partition, pin state for this partition index
		auto &partition = *partitions[partition_index];
		auto &partition_pin_state = state.partition_pin_states[partition_index];

		// Length and offset for this partition
		const auto &partition_entry = GETTER::GetValue(it);
		const auto &partition_length = partition_entry.length;
		const auto partition_offset = partition_entry.offset - partition_length;

		// Build out the buffer space for this partition
		const auto size_before = partition.SizeInBytes();
		partition.Build(partition_pin_state, state.chunk_state, partition_offset, partition_length);
		data_size += partition.SizeInBytes() - size_before;
	}
}